

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<ki::dml::Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
* __thiscall
pybind11::class_<ki::dml::Field<std::__cxx11::u16string>>::
def_property<std::__cxx11::u16string(ki::dml::Field<std::__cxx11::u16string>::*)()const,pybind11::return_value_policy>
          (class_<ki::dml::Field<std::__cxx11::u16string>> *this,char *name,
          offset_in_Field<signed_char>_to_subr *fget,cpp_function *fset,return_value_policy *extra)

{
  class_<ki::dml::Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *pcVar1;
  return_value_policy local_59;
  offset_in_Field<signed_char>_to_subr local_58;
  void *local_48;
  offset_in_Field<signed_char>_to_subr local_40;
  cpp_function local_38;
  return_value_policy *local_30;
  return_value_policy *extra_local;
  cpp_function *fset_local;
  offset_in_Field<signed_char>_to_subr *fget_local;
  char *name_local;
  class_<ki::dml::Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *this_local;
  
  local_48 = (void *)*fget;
  local_40 = fget[1];
  local_30 = extra;
  extra_local = (return_value_policy *)fset;
  fset_local = (cpp_function *)fget;
  fget_local = (offset_in_Field<signed_char>_to_subr *)name;
  name_local = (char *)this;
  local_58 = _ki__dml__Field<std::__cxx11::u16string>___pybind11__method_adaptor<ki::dml::Field<std::__cxx11::u16string>,std::__cxx11::u16string,ki::dml::Field<std::__cxx11::u16string>>_std____cxx11__u16string_ki__dml__Field<std::__cxx11::u16string>______const__
                       (local_48,local_40);
  cpp_function::cpp_function<std::__cxx11::u16string,ki::dml::Field<std::__cxx11::u16string>>
            (&local_38,local_58);
  local_59 = reference_internal;
  pcVar1 = def_property<pybind11::return_value_policy,pybind11::return_value_policy>
                     (this,name,&local_38,(cpp_function *)extra_local,&local_59,local_30);
  cpp_function::~cpp_function(&local_38);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(method_adaptor<type>(fget)), fset,
                            return_value_policy::reference_internal, extra...);
    }